

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_fp32_to_fp16_row(float *x,ggml_fp16_t *y,int64_t n)

{
  ggml_fp16_t gVar1;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  long in_RSI;
  float unaff_retaddr;
  int64_t i;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < CONCAT62(in_register_00000012,in_DX); local_20 = local_20 + 1) {
    gVar1 = ggml_compute_fp32_to_fp16(unaff_retaddr);
    *(ggml_fp16_t *)(in_RSI + local_20 * 2) = gVar1;
  }
  return;
}

Assistant:

void ggml_fp32_to_fp16_row(const float * x, ggml_fp16_t * y, int64_t n) {
    int64_t i = 0;
#if defined(__F16C__)
    //if (ggml_cpu_has_f16c()) {
        for (; i + 7 < n; i += 8) {
            __m256 x_vec = _mm256_loadu_ps(x + i);
            __m128i y_vec = _mm256_cvtps_ph(x_vec, _MM_FROUND_TO_NEAREST_INT);
            _mm_storeu_si128((__m128i *)(y + i), y_vec);
        }
        for(; i + 3 < n; i += 4) {
            __m128 x_vec = _mm_loadu_ps(x + i);
            __m128i y_vec = _mm_cvtps_ph(x_vec, _MM_FROUND_TO_NEAREST_INT);
            _mm_storel_epi64((__m128i *)(y + i), y_vec);
        }
    //}
#endif
    for (; i < n; i++) {
        y[i] = GGML_FP32_TO_FP16(x[i]);
    }
}